

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O1

int pk_get_rsapubkey(uchar **p,uchar *end,mbedtls_rsa_context *rsa)

{
  int iVar1;
  size_t sVar2;
  size_t len;
  size_t local_30;
  
  iVar1 = mbedtls_asn1_get_tag(p,end,&local_30,0x30);
  if (iVar1 == 0) {
    if (*p + local_30 != end) {
      return -0x3b66;
    }
    iVar1 = mbedtls_asn1_get_mpi(p,end,&rsa->N);
    if ((iVar1 == 0) && (iVar1 = mbedtls_asn1_get_mpi(p,end,&rsa->E), iVar1 == 0)) {
      if (*p != end) {
        return -0x3b66;
      }
      iVar1 = mbedtls_rsa_check_pubkey(rsa);
      if (iVar1 != 0) {
        return -0x3b00;
      }
      sVar2 = mbedtls_mpi_size(&rsa->N);
      rsa->len = sVar2;
      return 0;
    }
  }
  return iVar1 + -0x3b00;
}

Assistant:

static int pk_get_rsapubkey( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_rsa_context *rsa )
{
    int ret;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY + ret );

    if( *p + len != end )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    if( ( ret = mbedtls_asn1_get_mpi( p, end, &rsa->N ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( p, end, &rsa->E ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY + ret );

    if( *p != end )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    if( ( ret = mbedtls_rsa_check_pubkey( rsa ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY );

    rsa->len = mbedtls_mpi_size( &rsa->N );

    return( 0 );
}